

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

int randomInt(int low,int high)

{
  result_type_conflict rVar1;
  initializer_list<unsigned_long> __il;
  seed_seq seed;
  uniform_int_distribution<int> dist;
  mt19937 mt;
  seed_seq local_13c0;
  uniform_int_distribution<int> local_13a8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  local_13a0._M_x[0] = std::chrono::_V2::system_clock::now();
  __il._M_len = 1;
  __il._M_array = local_13a0._M_x;
  std::seed_seq::seed_seq<unsigned_long,void>(&local_13c0,__il);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(&local_13a0,&local_13c0);
  local_13a8._M_param._M_a = low;
  local_13a8._M_param._M_b = high;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&local_13a8,&local_13a0,&local_13a8._M_param);
  if (local_13c0._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13c0._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return rVar1;
}

Assistant:

int randomInt(int low, int high) {
    auto s1 = static_cast<long unsigned int>(std::chrono::high_resolution_clock::now().time_since_epoch().count());
    std::seed_seq seed{s1};
    std::mt19937 mt(seed);
    std::uniform_int_distribution<int> dist(low, high);
    return dist(mt);
}